

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V5_dimstyle.cpp
# Opt level: O0

bool __thiscall ON_V5x_DimStyle::Internal_Read_v5(ON_V5x_DimStyle *this,ON_BinaryArchive *file)

{
  bool bVar1;
  wchar_t *component_name;
  ON_UUID *pOVar2;
  ON_UUID OVar3;
  undefined1 local_64 [8];
  ON_UUID dimstyle_id;
  uint not_used;
  ON_TextStyle *text_style;
  ON__UINT32 local_40;
  int text_style_index;
  uint ui;
  ON_wString local_30;
  ON_wString dimstyle_name;
  int dimstyle_index;
  int iStack_1c;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *file_local;
  ON_V5x_DimStyle *this_local;
  
  _minor_version = file;
  file_local = (ON_BinaryArchive *)this;
  ON_ModelComponent::ClearModelComponentAttributes(&this->super_ON_ModelComponent,0x1ff);
  iStack_1c = 0;
  dimstyle_index = 0;
  dimstyle_name.m_s._7_1_ =
       ON_BinaryArchive::Read3dmChunkVersion
                 (_minor_version,&stack0xffffffffffffffe4,&dimstyle_index);
  if (iStack_1c < 1) {
    dimstyle_name.m_s._7_1_ = 0;
  }
  else {
    dimstyle_name.m_s._0_4_ = ON_ModelComponent::Index(&this->super_ON_ModelComponent);
    if ((dimstyle_name.m_s._7_1_ & 1) != 0) {
      dimstyle_name.m_s._7_1_ =
           ON_BinaryArchive::ReadInt(_minor_version,(ON__INT32 *)&dimstyle_name);
    }
    if ((dimstyle_name.m_s._7_1_ & 1) != 0) {
      ON_ModelComponent::SetIndex(&this->super_ON_ModelComponent,(int)dimstyle_name.m_s);
    }
    ON_wString::ON_wString(&local_30);
    if ((dimstyle_name.m_s._7_1_ & 1) != 0) {
      dimstyle_name.m_s._7_1_ = ON_BinaryArchive::ReadString(_minor_version,&local_30);
    }
    if ((dimstyle_name.m_s._7_1_ & 1) != 0) {
      component_name = ON_wString::operator_cast_to_wchar_t_(&local_30);
      ON_ModelComponent::SetName(&this->super_ON_ModelComponent,component_name);
    }
    if ((dimstyle_name.m_s._7_1_ & 1) != 0) {
      dimstyle_name.m_s._7_1_ = ON_BinaryArchive::ReadDouble(_minor_version,&this->m_extextension);
    }
    if ((dimstyle_name.m_s._7_1_ & 1) != 0) {
      dimstyle_name.m_s._7_1_ = ON_BinaryArchive::ReadDouble(_minor_version,&this->m_extoffset);
    }
    if ((dimstyle_name.m_s._7_1_ & 1) != 0) {
      dimstyle_name.m_s._7_1_ = ON_BinaryArchive::ReadDouble(_minor_version,&this->m_arrowsize);
    }
    if ((dimstyle_name.m_s._7_1_ & 1) != 0) {
      dimstyle_name.m_s._7_1_ = ON_BinaryArchive::ReadDouble(_minor_version,&this->m_centermark);
    }
    if ((dimstyle_name.m_s._7_1_ & 1) != 0) {
      dimstyle_name.m_s._7_1_ = ON_BinaryArchive::ReadDouble(_minor_version,&this->m_textgap);
    }
    local_40 = 0;
    if ((dimstyle_name.m_s._7_1_ & 1) != 0) {
      dimstyle_name.m_s._7_1_ = ON_BinaryArchive::ReadInt(_minor_version,&local_40);
    }
    if ((dimstyle_name.m_s._7_1_ & 1) != 0) {
      this->m_dimstyle_textalign = (V5_TextDisplayMode)local_40;
    }
    if ((dimstyle_name.m_s._7_1_ & 1) != 0) {
      dimstyle_name.m_s._7_1_ = ON_BinaryArchive::ReadInt(_minor_version,&this->m_arrowtype);
    }
    if ((dimstyle_name.m_s._7_1_ & 1) != 0) {
      dimstyle_name.m_s._7_1_ = ON_BinaryArchive::ReadInt(_minor_version,&this->m_angularunits);
    }
    if ((dimstyle_name.m_s._7_1_ & 1) != 0) {
      dimstyle_name.m_s._7_1_ = ON_BinaryArchive::ReadInt(_minor_version,&this->m_lengthformat);
    }
    if ((dimstyle_name.m_s._7_1_ & 1) != 0) {
      dimstyle_name.m_s._7_1_ = ON_BinaryArchive::ReadInt(_minor_version,&this->m_angleformat);
    }
    if ((dimstyle_name.m_s._7_1_ & 1) != 0) {
      dimstyle_name.m_s._7_1_ = ON_BinaryArchive::ReadInt(_minor_version,&this->m_lengthresolution);
    }
    if ((dimstyle_name.m_s._7_1_ & 1) != 0) {
      dimstyle_name.m_s._7_1_ = ON_BinaryArchive::ReadInt(_minor_version,&this->m_angleresolution);
    }
    text_style._4_4_ = -0x7fffffff;
    if ((dimstyle_name.m_s._7_1_ & 1) != 0) {
      dimstyle_name.m_s._7_1_ =
           ON_BinaryArchive::ReadInt(_minor_version,(ON__INT32 *)((long)&text_style + 4));
    }
    if (((dimstyle_name.m_s._7_1_ & 1) != 0) &&
       (register0x00000000 =
             ON_BinaryArchive::ArchiveTextStyleFromArchiveTextStyleIndex
                       (_minor_version,text_style._4_4_), register0x00000000 != (ON_TextStyle *)0x0)
       ) {
      ON_TextStyle::operator=(&this->m_v5_text_style,register0x00000000);
    }
    if (((dimstyle_name.m_s._7_1_ & 1) != 0) && (dimstyle_index < 3)) {
      ON_ModelComponent::SetId(&this->super_ON_ModelComponent);
    }
    if ((0 < dimstyle_index) && ((dimstyle_name.m_s._7_1_ & 1) != 0)) {
      dimstyle_name.m_s._7_1_ = ON_BinaryArchive::ReadDouble(_minor_version,&this->m_textheight);
    }
    if (1 < dimstyle_index) {
      if (((dimstyle_name.m_s._7_1_ & 1) != 0) &&
         (dimstyle_name.m_s._7_1_ =
               ON_BinaryArchive::ReadDouble(_minor_version,&this->m_lengthfactor),
         (bool)dimstyle_name.m_s._7_1_)) {
        ON_Internal_FixBogusDimStyleLengthFactor(_minor_version,&this->m_lengthfactor);
      }
      if ((dimstyle_name.m_s._7_1_ & 1) != 0) {
        dimstyle_name.m_s._7_1_ = ON_BinaryArchive::ReadString(_minor_version,&this->m_prefix);
      }
      if ((dimstyle_name.m_s._7_1_ & 1) != 0) {
        dimstyle_name.m_s._7_1_ = ON_BinaryArchive::ReadString(_minor_version,&this->m_suffix);
      }
      if ((dimstyle_name.m_s._7_1_ & 1) != 0) {
        dimstyle_name.m_s._7_1_ = ON_BinaryArchive::ReadBool(_minor_version,&this->m_bAlternate);
      }
      if ((dimstyle_name.m_s._7_1_ & 1) != 0) {
        dimstyle_name.m_s._7_1_ =
             ON_BinaryArchive::ReadDouble(_minor_version,&this->m_alternate_lengthfactor);
      }
      if ((dimstyle_name.m_s._7_1_ & 1) != 0) {
        ON_Internal_FixBogusDimStyleLengthFactor(_minor_version,&this->m_alternate_lengthfactor);
      }
      if ((dimstyle_name.m_s._7_1_ & 1) != 0) {
        dimstyle_name.m_s._7_1_ =
             ON_BinaryArchive::ReadInt(_minor_version,&this->m_alternate_lengthformat);
      }
      if ((dimstyle_name.m_s._7_1_ & 1) != 0) {
        dimstyle_name.m_s._7_1_ =
             ON_BinaryArchive::ReadInt(_minor_version,&this->m_alternate_lengthresolution);
      }
      if ((dimstyle_name.m_s._7_1_ & 1) != 0) {
        dimstyle_name.m_s._7_1_ =
             ON_BinaryArchive::ReadInt(_minor_version,&this->m_alternate_angleformat);
      }
      if ((dimstyle_name.m_s._7_1_ & 1) != 0) {
        dimstyle_name.m_s._7_1_ =
             ON_BinaryArchive::ReadInt(_minor_version,&this->m_alternate_angleresolution);
      }
      if ((dimstyle_name.m_s._7_1_ & 1) != 0) {
        dimstyle_name.m_s._7_1_ =
             ON_BinaryArchive::ReadString(_minor_version,&this->m_alternate_prefix);
      }
      if ((dimstyle_name.m_s._7_1_ & 1) != 0) {
        dimstyle_name.m_s._7_1_ =
             ON_BinaryArchive::ReadString(_minor_version,&this->m_alternate_suffix);
      }
      dimstyle_id.Data4[0] = '\0';
      dimstyle_id.Data4[1] = '\0';
      dimstyle_id.Data4[2] = '\0';
      dimstyle_id.Data4[3] = '\0';
      if ((dimstyle_name.m_s._7_1_ & 1) != 0) {
        dimstyle_name.m_s._7_1_ =
             ON_BinaryArchive::ReadInt(_minor_version,(ON__UINT32 *)dimstyle_id.Data4);
      }
      if (2 < dimstyle_index) {
        pOVar2 = ON_ModelComponent::Id(&this->super_ON_ModelComponent);
        local_64._0_4_ = pOVar2->Data1;
        local_64._4_2_ = pOVar2->Data2;
        local_64._6_2_ = pOVar2->Data3;
        dimstyle_id._0_8_ = *(undefined8 *)pOVar2->Data4;
        if ((dimstyle_name.m_s._7_1_ & 1) != 0) {
          dimstyle_name.m_s._7_1_ = ON_BinaryArchive::ReadUuid(_minor_version,(ON_UUID *)local_64);
        }
        if ((dimstyle_name.m_s._7_1_ & 1) != 0) {
          bVar1 = ::operator==(&ON_nil_uuid,(ON_UUID_struct *)local_64);
          OVar3.Data4 = (uchar  [8])dimstyle_id._0_8_;
          OVar3.Data1 = local_64._0_4_;
          OVar3.Data2 = local_64._4_2_;
          OVar3.Data3 = local_64._6_2_;
          if (bVar1) {
            OVar3 = ON_CreateId();
          }
          dimstyle_id._0_8_ = OVar3.Data4;
          local_64 = OVar3._0_8_;
          ON_ModelComponent::SetId(&this->super_ON_ModelComponent,(ON_UUID *)local_64);
        }
      }
    }
    if ((3 < dimstyle_index) && ((dimstyle_name.m_s._7_1_ & 1) != 0)) {
      dimstyle_name.m_s._7_1_ = ON_BinaryArchive::ReadDouble(_minor_version,&this->m_dimextension);
    }
    if (4 < dimstyle_index) {
      if ((dimstyle_name.m_s._7_1_ & 1) != 0) {
        dimstyle_name.m_s._7_1_ =
             ON_BinaryArchive::ReadDouble(_minor_version,&this->m_leaderarrowsize);
      }
      if ((dimstyle_name.m_s._7_1_ & 1) != 0) {
        dimstyle_name.m_s._7_1_ = ON_BinaryArchive::ReadInt(_minor_version,&this->m_leaderarrowtype)
        ;
      }
      if ((dimstyle_name.m_s._7_1_ & 1) != 0) {
        dimstyle_name.m_s._7_1_ =
             ON_BinaryArchive::ReadBool(_minor_version,&this->m_bSuppressExtension1);
      }
      if ((dimstyle_name.m_s._7_1_ & 1) != 0) {
        dimstyle_name.m_s._7_1_ =
             ON_BinaryArchive::ReadBool(_minor_version,&this->m_bSuppressExtension2);
      }
    }
    ON_wString::~ON_wString(&local_30);
  }
  if ((dimstyle_name.m_s._7_1_ & 1) != 0) {
    ON_ModelComponent::IfIdIsNilSetId(&this->super_ON_ModelComponent);
  }
  return (bool)(dimstyle_name.m_s._7_1_ & 1);
}

Assistant:

bool ON_V5x_DimStyle::Internal_Read_v5(
  ON_BinaryArchive& file // restore definition from binary archive
  )
{
  ClearModelComponentAttributes(ON_ModelComponent::Attributes::AllAttributes);

  int major_version = 0;
  int minor_version = 0;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);


  if ( major_version >= 1 ) 
  {
    int dimstyle_index = Index();
    if ( rc) rc = file.ReadInt( &dimstyle_index);
    if ( rc )
      SetIndex(dimstyle_index);

    ON_wString dimstyle_name;
    if ( rc) rc = file.ReadString( dimstyle_name);
    if (rc)
      SetName(dimstyle_name);
    
    if ( rc) rc = file.ReadDouble( &m_extextension);
    if ( rc) rc = file.ReadDouble( &m_extoffset);
    if ( rc) rc = file.ReadDouble( &m_arrowsize);
    if ( rc) rc = file.ReadDouble( &m_centermark);
    if ( rc) rc = file.ReadDouble( &m_textgap);
    
    unsigned int ui = 0;
    if (rc) rc = file.ReadInt(&ui);
    if (rc) m_dimstyle_textalign = (ON_INTERNAL_OBSOLETE::V5_TextDisplayMode)ui;
    if ( rc) rc = file.ReadInt( &m_arrowtype);
    if ( rc) rc = file.ReadInt( &m_angularunits);
    if ( rc) rc = file.ReadInt( &m_lengthformat);
    if ( rc) rc = file.ReadInt( &m_angleformat);
    if ( rc) rc = file.ReadInt( &m_lengthresolution);
    if ( rc) rc = file.ReadInt( &m_angleresolution);
    int text_style_index = ON_UNSET_INT_INDEX;
    if ( rc) rc = file.ReadInt( &text_style_index);
    if (rc)
    {
      const ON_TextStyle* text_style = file.ArchiveTextStyleFromArchiveTextStyleIndex(text_style_index);
      if (text_style)
        m_v5_text_style = *text_style;
    }

    if ( rc && minor_version < 3 )
      SetId(); // older versions did not have an id.

    if( minor_version >= 1)
      if ( rc) rc = file.ReadDouble( &m_textheight);

    // added 1/13/05
    if( minor_version >= 2)
    {
      if (rc)
      {
        rc = file.ReadDouble(&m_lengthfactor);
        if (rc)
          ON_Internal_FixBogusDimStyleLengthFactor(file, m_lengthfactor);
      }

      if (rc) rc = file.ReadString( m_prefix);
      if (rc) rc = file.ReadString( m_suffix);

      if (rc) rc = file.ReadBool( &m_bAlternate);
      if (rc) rc = file.ReadDouble(&m_alternate_lengthfactor);
      if (rc)
        ON_Internal_FixBogusDimStyleLengthFactor(file, m_alternate_lengthfactor);

      if (rc) rc = file.ReadInt( &m_alternate_lengthformat);
      if (rc) rc = file.ReadInt( &m_alternate_lengthresolution);
      if (rc) rc = file.ReadInt( &m_alternate_angleformat);
      if (rc) rc = file.ReadInt( &m_alternate_angleresolution);
      if (rc) rc = file.ReadString( m_alternate_prefix);
      if (rc) rc = file.ReadString( m_alternate_suffix);

      unsigned int not_used = 0;
      if (rc) rc = file.ReadInt( &not_used);

      if ( minor_version >= 3 )
      {
        ON_UUID dimstyle_id = Id();
        if (rc) rc = file.ReadUuid(dimstyle_id);
        if (rc)
        {
          if (ON_nil_uuid == dimstyle_id)
            dimstyle_id = ON_CreateId();  // non-nil id is required
          SetId(dimstyle_id);
        }
      }
    }
    // Added Dec 28, 05 ver 1.4
    if( minor_version >= 4)
      if( rc) rc = file.ReadDouble( &m_dimextension);

    // Added Mar 23 06 ver 1.5
    if( minor_version >= 5)
    {
      if (rc) rc = file.ReadDouble( &m_leaderarrowsize);
      if (rc) rc = file.ReadInt( &m_leaderarrowtype);
      if (rc) rc = file.ReadBool( &m_bSuppressExtension1);
      if (rc) rc = file.ReadBool( &m_bSuppressExtension2);
    }
  }
  else
    rc = false;

  if (rc)
    IfIdIsNilSetId();

  return rc;
}